

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O0

void __thiscall
cmTarget::ComputeVersionedName
          (cmTarget *this,string *vName,string *prefix,string *base,string *suffix,string *name,
          char *version)

{
  string local_88 [48];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string *local_38;
  string *name_local;
  string *suffix_local;
  string *base_local;
  string *prefix_local;
  string *vName_local;
  cmTarget *this_local;
  
  local_38 = name;
  name_local = suffix;
  suffix_local = base;
  base_local = prefix;
  prefix_local = vName;
  vName_local = (string *)this;
  if ((this->IsApple & 1U) == 0) {
    std::__cxx11::string::string((string *)&local_58,(string *)name);
  }
  else {
    std::operator+(&local_58,prefix,base);
  }
  std::__cxx11::string::operator=((string *)prefix_local,(string *)&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  if (version != (char *)0x0) {
    std::__cxx11::string::operator+=((string *)prefix_local,".");
    std::__cxx11::string::operator+=((string *)prefix_local,version);
  }
  if ((this->IsApple & 1U) == 0) {
    std::__cxx11::string::string(local_88);
  }
  else {
    std::__cxx11::string::string(local_88,(string *)name_local);
  }
  std::__cxx11::string::operator+=((string *)prefix_local,local_88);
  std::__cxx11::string::~string(local_88);
  return;
}

Assistant:

void cmTarget::ComputeVersionedName(std::string& vName,
                                    std::string const& prefix,
                                    std::string const& base,
                                    std::string const& suffix,
                                    std::string const& name,
                                    const char* version) const
{
  vName = this->IsApple? (prefix+base) : name;
  if(version)
    {
    vName += ".";
    vName += version;
    }
  vName += this->IsApple? suffix : std::string();
}